

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro_function.cpp
# Opt level: O1

MacroBindResult *
duckdb::MacroFunction::BindMacroFunction
          (MacroBindResult *__return_storage_ptr__,
          vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
          *functions,string *name,FunctionExpression *function_expr,
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
          *positionals,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
          *defaults)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var3;
  pointer pcVar4;
  pointer puVar5;
  MacroBindResult *pMVar6;
  undefined8 uVar7;
  pointer pPVar8;
  const_iterator cVar9;
  mapped_type *pmVar10;
  const_reference pvVar11;
  pointer pMVar12;
  idx_t __n;
  type pMVar13;
  iterator iVar14;
  long *plVar15;
  undefined8 *puVar16;
  size_type *psVar17;
  __node_base *p_Var18;
  _Hash_node_base *p_Var19;
  pointer this;
  size_type __n_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  long lVar20;
  pointer this_00;
  bool bVar21;
  string error;
  optional_idx result_idx;
  string local_288;
  MacroBindResult *local_268;
  undefined1 local_260 [32];
  string *local_240;
  optional_idx local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  char local_220 [16];
  pointer local_210;
  size_type local_208;
  char local_200;
  undefined7 uStack_1ff;
  undefined8 uStack_1f8;
  pointer local_1f0;
  size_type local_1e8;
  char local_1e0;
  undefined7 uStack_1df;
  undefined8 uStack_1d8;
  FunctionExpression *local_1d0;
  size_type local_1c8;
  undefined1 local_1c0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  string local_150 [16];
  undefined1 local_140 [16];
  string local_130;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *local_110 [2];
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  local_100 [2];
  string local_f0;
  string local_d0;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  puVar2 = (function_expr->children).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)positionals;
  local_268 = __return_storage_ptr__;
  local_240 = name;
  for (this = (function_expr->children).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start; bVar21 = this != puVar2, bVar21;
      this = this + 1) {
    pPVar8 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(this);
    if ((pPVar8->super_BaseExpression).alias._M_string_length == 0) {
      if ((defaults->_M_h)._M_element_count != 0) {
        local_1d0 = (FunctionExpression *)local_1c0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d0,
                   "Positional parameters cannot come after parameters with a default value!","");
        (local_268->function_idx).index = 0xffffffffffffffff;
        paVar1 = &(local_268->error).field_2;
        (local_268->error)._M_dataplus._M_p = (pointer)paVar1;
        if (local_1d0 == (FunctionExpression *)local_1c0) {
          paVar1->_M_allocated_capacity = CONCAT71(local_1c0._1_7_,local_1c0[0]);
          *(undefined8 *)((long)&(local_268->error).field_2 + 8) = local_1c0._8_8_;
        }
        else {
          (local_268->error)._M_dataplus._M_p = (pointer)local_1d0;
          (local_268->error).field_2._M_allocated_capacity = CONCAT71(local_1c0._1_7_,local_1c0[0]);
        }
        (local_268->error)._M_string_length = local_1c8;
        local_1c8 = 0;
        local_1c0[0] = 0;
        function_expr = local_1d0;
        local_1d0 = (FunctionExpression *)local_1c0;
        goto LAB_011f103f;
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)positionals,this);
    }
    else {
      pPVar8 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(this);
      cVar9 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&defaults->_M_h,&(pPVar8->super_BaseExpression).alias);
      if (cVar9.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        local_70[0] = local_60;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_70,"Duplicate default parameters %s!","");
        pPVar8 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(this);
        pcVar4 = (pPVar8->super_BaseExpression).alias._M_dataplus._M_p;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar4,
                   pcVar4 + (pPVar8->super_BaseExpression).alias._M_string_length);
        StringUtil::Format<std::__cxx11::string>
                  ((string *)(local_1c0 + 0x10),(StringUtil *)local_70,&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   function_expr);
        function_expr = (FunctionExpression *)local_1c0._24_8_;
        (local_268->function_idx).index = 0xffffffffffffffff;
        paVar1 = &(local_268->error).field_2;
        (local_268->error)._M_dataplus._M_p = (pointer)paVar1;
        pcVar4 = local_1c0 + 0x20;
        if ((pointer)local_1c0._16_8_ == pcVar4) {
          paVar1->_M_allocated_capacity = CONCAT71(local_1c0._33_7_,local_1c0[0x20]);
          *(undefined8 *)((long)&(local_268->error).field_2 + 8) = local_1c0._40_8_;
        }
        else {
          (local_268->error)._M_dataplus._M_p = (pointer)local_1c0._16_8_;
          (local_268->error).field_2._M_allocated_capacity =
               CONCAT71(local_1c0._33_7_,local_1c0[0x20]);
        }
        (local_268->error)._M_string_length = local_1c0._24_8_;
        local_1c0._24_8_ = (FunctionExpression *)0x0;
        local_1c0[0x20] = '\0';
        local_1c0._16_8_ = pcVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0]);
        }
LAB_011f103f:
        if (bVar21) {
          return local_268;
        }
        break;
      }
      pPVar8 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(this);
      pmVar10 = ::std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)defaults,&(pPVar8->super_BaseExpression).alias);
      function_expr =
           (FunctionExpression *)
           (this->
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (this->
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (ParsedExpression *)0x0;
      _Var3._M_head_impl =
           (pmVar10->
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (pmVar10->
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (ParsedExpression *)function_expr;
      if (_Var3._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
      }
    }
  }
  local_238.index = 0xffffffffffffffff;
  if ((functions->
      super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (functions->
      super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n_00 = 0;
    do {
      pvVar11 = vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
                ::operator[](functions,__n_00);
      pMVar12 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>
                ::operator->(pvVar11);
      function_expr =
           (FunctionExpression *)
           ((long)(pMVar12->parameters).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(pMVar12->parameters).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      if (function_expr ==
          (FunctionExpression *)
          ((long)(positionals->
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(positionals->
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start)) {
        optional_idx::optional_idx((optional_idx *)local_260,__n_00);
        local_238.index = local_260._0_8_;
        break;
      }
      __n_00 = __n_00 + 1;
    } while (__n_00 < (ulong)((long)(functions->
                                    super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(functions->
                                    super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if ((ParsedExpression *)local_238.index == (ParsedExpression *)0xffffffffffffffff) {
    local_260._0_8_ = local_260 + 0x10;
    local_260._8_8_ = 0;
    local_260[0x10] = '\0';
    if ((long)(functions->
              super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(functions->
              super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 8) {
      pvVar11 = vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
                ::operator[](functions,0);
      pMVar13 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>
                ::operator*(pvVar11);
      local_b0[0] = local_a0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b0,"Macro function %s requires ","");
      FormatMacroFunction(&local_50,pMVar13,local_240);
      StringUtil::Format<std::__cxx11::string>
                (&local_288,(StringUtil *)local_b0,&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)function_expr)
      ;
      ::std::__cxx11::string::operator=((string *)local_260,(string *)&local_288);
      paVar1 = &local_288.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != paVar1) {
        operator_delete(local_288._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0]);
      }
      lVar20 = (long)(pMVar13->parameters).
                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pMVar13->parameters).
                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      if (lVar20 == 8) {
        local_288._M_dataplus._M_p = (pointer)paVar1;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_288,"a single positional argument","");
      }
      else {
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"%i positional arguments","");
        Exception::ConstructMessage<unsigned_long>
                  (&local_288,&local_d0,
                   (long)(pMVar13->parameters).
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pMVar13->parameters).
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
      }
      ::std::__cxx11::string::_M_append(local_260,(ulong)local_288._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != paVar1) {
        operator_delete(local_288._M_dataplus._M_p);
      }
      if ((lVar20 != 8) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2)) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      ::std::__cxx11::string::append(local_260);
      lVar20 = (long)(positionals->
                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(positionals->
                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      if (lVar20 == 8) {
        local_288._M_dataplus._M_p = (pointer)paVar1;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_288,"a single positional argument was","");
      }
      else {
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"%i positional arguments were","");
        Exception::ConstructMessage<unsigned_long>
                  (&local_288,&local_f0,
                   (long)(positionals->
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ).
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(positionals->
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ).
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
      }
      ::std::__cxx11::string::_M_append(local_260,(ulong)local_288._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != paVar1) {
        operator_delete(local_288._M_dataplus._M_p);
      }
      if ((lVar20 != 8) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2)) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      ::std::__cxx11::string::append(local_260);
    }
    else {
      local_110[0] = local_100;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"Macro \"%s\" does not support %llu parameters.\n","");
      pcVar4 = (local_240->_M_dataplus)._M_p;
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,pcVar4,pcVar4 + local_240->_M_string_length);
      StringUtil::Format<std::__cxx11::string,unsigned_long>
                (&local_288,(StringUtil *)local_110,&local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)(positionals->
                        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(positionals->
                        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3),(unsigned_long)params_1);
      ::std::__cxx11::string::_M_append(local_260,(ulong)local_288._M_dataplus._M_p);
      paVar1 = &local_288.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != paVar1) {
        operator_delete(local_288._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      if (local_110[0] != local_100) {
        operator_delete(local_110[0]);
      }
      ::std::__cxx11::string::append(local_260);
      this_00 = (functions->
                super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar5 = (functions->
               super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
               ).
               super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (this_00 != puVar5) {
        do {
          pMVar13 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>
                    ::operator*(this_00);
          FormatMacroFunction((string *)&local_230,pMVar13,local_240);
          puVar16 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,0x1dd9ab7);
          psVar17 = puVar16 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar16 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar17) {
            local_288.field_2._M_allocated_capacity = *psVar17;
            local_288.field_2._8_8_ = puVar16[3];
            local_288._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_288.field_2._M_allocated_capacity = *psVar17;
            local_288._M_dataplus._M_p = (pointer)*puVar16;
          }
          local_288._M_string_length = puVar16[1];
          *puVar16 = psVar17;
          puVar16[1] = 0;
          *(undefined1 *)(puVar16 + 2) = 0;
          ::std::__cxx11::string::_M_append(local_260,(ulong)local_288._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != paVar1) {
            operator_delete(local_288._M_dataplus._M_p);
          }
          if ((char *)local_230._M_allocated_capacity != local_220) {
            operator_delete((void *)local_230._M_allocated_capacity);
          }
          this_00 = this_00 + 1;
        } while (this_00 != puVar5);
      }
    }
    local_1f0 = &local_1e0;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f0,local_260._0_8_,(pointer)(local_260._0_8_ + local_260._8_8_));
    (local_268->function_idx).index = 0xffffffffffffffff;
    paVar1 = &(local_268->error).field_2;
    (local_268->error)._M_dataplus._M_p = (pointer)paVar1;
    if (local_1f0 == &local_1e0) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_1df,local_1e0);
      *(undefined8 *)((long)&(local_268->error).field_2 + 8) = uStack_1d8;
    }
    else {
      (local_268->error)._M_dataplus._M_p = local_1f0;
      (local_268->error).field_2._M_allocated_capacity = CONCAT71(uStack_1df,local_1e0);
    }
    (local_268->error)._M_string_length = local_1e8;
    local_1e8 = 0;
    local_1e0 = '\0';
    local_1f0 = &local_1e0;
  }
  else {
    __n = optional_idx::GetIndex(&local_238);
    pvVar11 = vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
              ::operator[](functions,__n);
    pMVar13 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>::
              operator*(pvVar11);
    p_Var18 = &(defaults->_M_h)._M_before_begin;
    do {
      p_Var18 = p_Var18->_M_nxt;
      if (p_Var18 == (__node_base *)0x0) {
        p_Var19 = (pMVar13->default_parameters)._M_h._M_before_begin._M_nxt;
        if (p_Var19 != (_Hash_node_base *)0x0) {
          do {
            cVar9 = ::std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(&defaults->_M_h,(key_type *)(p_Var19 + 1));
            if (cVar9.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              pPVar8 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                     *)(p_Var19 + 5));
              (*(pPVar8->super_BaseExpression)._vptr_BaseExpression[0xc])(local_260,pPVar8);
              pmVar10 = ::std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)defaults,(key_type *)(p_Var19 + 1));
              uVar7 = local_260._0_8_;
              local_260._0_8_ = (ParsedExpression *)0x0;
              _Var3._M_head_impl =
                   (pmVar10->
                   super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   )._M_t.
                   super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
              (pmVar10->
              super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
              .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                   (ParsedExpression *)uVar7;
              if (_Var3._M_head_impl != (ParsedExpression *)0x0) {
                (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
              }
              if ((ParsedExpression *)local_260._0_8_ != (ParsedExpression *)0x0) {
                (**(code **)(*(long *)local_260._0_8_ + 8))();
              }
            }
            p_Var19 = p_Var19->_M_nxt;
          } while (p_Var19 != (_Hash_node_base *)0x0);
        }
        pMVar6 = local_268;
        optional_idx::optional_idx(&local_268->function_idx,__n);
        (pMVar6->error)._M_dataplus._M_p = (pointer)&(pMVar6->error).field_2;
        (pMVar6->error)._M_string_length = 0;
        (pMVar6->error).field_2._M_local_buf[0] = '\0';
        return local_268;
      }
      iVar14 = ::std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(&(pMVar13->default_parameters)._M_h,(key_type *)(p_Var18 + 1));
    } while (iVar14.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_true>
             ._M_cur != (__node_type *)0x0);
    local_150._0_8_ = local_140;
    ::std::__cxx11::string::_M_construct<char_const*>
              (local_150,"Macro \"%s\" does not have a named parameter \"%s\"\n","");
    pcVar4 = (local_240->_M_dataplus)._M_p;
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,pcVar4,pcVar4 + local_240->_M_string_length);
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)(local_1c0 + 0x30),p_Var18[1]._M_nxt,
               (long)&(*(_Hash_node_base **)
                        &((_Prime_rehash_policy *)(p_Var18 + 2))->_M_max_load_factor)->_M_nxt +
               (long)p_Var18[1]._M_nxt);
    StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
              ((string *)local_260,(StringUtil *)local_150,&local_170,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_1c0 + 0x30),params_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    pMVar6 = local_268;
    if ((undefined1 *)local_150._0_8_ != local_140) {
      operator_delete((void *)local_150._0_8_);
    }
    FormatMacroFunction((string *)&local_230,pMVar13,local_240);
    plVar15 = (long *)::std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,0x1debec1);
    psVar17 = (size_type *)(plVar15 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_288.field_2._M_allocated_capacity = *psVar17;
      local_288.field_2._8_8_ = plVar15[3];
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    }
    else {
      local_288.field_2._M_allocated_capacity = *psVar17;
      local_288._M_dataplus._M_p = (pointer)*plVar15;
    }
    local_288._M_string_length = plVar15[1];
    *plVar15 = (long)psVar17;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    ::std::__cxx11::string::_M_append(local_260,(ulong)local_288._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p);
    }
    if ((char *)local_230._M_allocated_capacity != local_220) {
      operator_delete((void *)local_230._M_allocated_capacity);
    }
    local_210 = &local_200;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_210,local_260._0_8_,(pointer)(local_260._0_8_ + local_260._8_8_));
    (pMVar6->function_idx).index = 0xffffffffffffffff;
    paVar1 = &(pMVar6->error).field_2;
    (pMVar6->error)._M_dataplus._M_p = (pointer)paVar1;
    if (local_210 == &local_200) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_1ff,local_200);
      *(undefined8 *)((long)&(pMVar6->error).field_2 + 8) = uStack_1f8;
    }
    else {
      (pMVar6->error)._M_dataplus._M_p = local_210;
      (pMVar6->error).field_2._M_allocated_capacity = CONCAT71(uStack_1ff,local_200);
    }
    (pMVar6->error)._M_string_length = local_208;
    local_208 = 0;
    local_200 = '\0';
    local_210 = &local_200;
  }
  if ((ParsedExpression *)local_260._0_8_ != (ParsedExpression *)(local_260 + 0x10)) {
    operator_delete((void *)local_260._0_8_);
  }
  return local_268;
}

Assistant:

MacroBindResult MacroFunction::BindMacroFunction(const vector<unique_ptr<MacroFunction>> &functions, const string &name,
                                                 FunctionExpression &function_expr,
                                                 vector<unique_ptr<ParsedExpression>> &positionals,
                                                 unordered_map<string, unique_ptr<ParsedExpression>> &defaults) {
	// separate positional and default arguments
	for (auto &arg : function_expr.children) {
		if (!arg->GetAlias().empty()) {
			// default argument
			if (defaults.count(arg->GetAlias())) {
				return MacroBindResult(StringUtil::Format("Duplicate default parameters %s!", arg->GetAlias()));
			}
			defaults[arg->GetAlias()] = std::move(arg);
		} else if (!defaults.empty()) {
			return MacroBindResult("Positional parameters cannot come after parameters with a default value!");
		} else {
			// positional argument
			positionals.push_back(std::move(arg));
		}
	}

	// check for each macro function if it matches the number of positional arguments
	optional_idx result_idx;
	for (idx_t function_idx = 0; function_idx < functions.size(); function_idx++) {
		if (functions[function_idx]->parameters.size() == positionals.size()) {
			// found a matching function
			result_idx = function_idx;
			break;
		}
	}
	if (!result_idx.IsValid()) {
		// no matching function found
		string error;
		if (functions.size() == 1) {
			// we only have one function - print the old more detailed error message
			auto &macro_def = *functions[0];
			auto &parameters = macro_def.parameters;
			error = StringUtil::Format("Macro function %s requires ", FormatMacroFunction(macro_def, name));
			error += parameters.size() == 1 ? "a single positional argument"
			                                : StringUtil::Format("%i positional arguments", parameters.size());
			error += ", but ";
			error += positionals.size() == 1 ? "a single positional argument was"
			                                 : StringUtil::Format("%i positional arguments were", positionals.size());
			error += " provided.";
		} else {
			// we have multiple functions - list all candidates
			error += StringUtil::Format("Macro \"%s\" does not support %llu parameters.\n", name, positionals.size());
			error += "Candidate macros:";
			for (auto &function : functions) {
				error += "\n\t" + FormatMacroFunction(*function, name);
			}
		}
		return MacroBindResult(error);
	}
	// found a matching index - check if the default values exist within the macro
	auto macro_idx = result_idx.GetIndex();
	auto &macro_def = *functions[macro_idx];
	for (auto &default_val : defaults) {
		auto entry = macro_def.default_parameters.find(default_val.first);
		if (entry == macro_def.default_parameters.end()) {
			string error =
			    StringUtil::Format("Macro \"%s\" does not have a named parameter \"%s\"\n", name, default_val.first);
			error += "\nMacro definition: " + FormatMacroFunction(macro_def, name);
			return MacroBindResult(error);
		}
	}
	// Add the default values for parameters that have defaults, that were not explicitly assigned to
	for (auto it = macro_def.default_parameters.begin(); it != macro_def.default_parameters.end(); it++) {
		auto &parameter_name = it->first;
		auto &parameter_default = it->second;
		if (!defaults.count(parameter_name)) {
			// This parameter was not set yet, set it with the default value
			defaults[parameter_name] = parameter_default->Copy();
		}
	}
	return MacroBindResult(macro_idx);
}